

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocksort.c
# Opt level: O3

void BZ2_blockSort(EState *s)

{
  int *piVar1;
  ulong uVar2;
  byte *pbVar3;
  byte bVar4;
  int verb;
  UInt32 UVar5;
  undefined4 uVar6;
  UInt32 *pUVar7;
  byte *block;
  char cVar8;
  Bool_conflict BVar9;
  UInt32 UVar10;
  int iVar11;
  Int32 *pIVar12;
  uint *puVar13;
  byte bVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  long lVar21;
  byte bVar22;
  ulong uVar23;
  int iVar24;
  uint uVar25;
  long lVar26;
  byte bVar27;
  UInt16 UVar28;
  ushort uVar29;
  Int32 zztmp_1;
  int iVar30;
  uint uVar31;
  UInt32 *pUVar32;
  uint uVar33;
  uint uVar34;
  ulong uVar35;
  long lVar36;
  Int32 zztmp;
  UInt32 *pUVar37;
  int iVar38;
  bool bVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  Int32 budget;
  Bool_conflict bigDone [256];
  Int32 stackHi [100];
  Int32 stackLo [100];
  Int32 runningOrder [256];
  Int32 copyStart [256];
  int local_12e0;
  int local_12b8;
  uint local_12b4;
  ulong local_12b0;
  long local_12a8;
  ulong local_12a0;
  ulong local_1298;
  UInt16 *local_1290;
  int local_1288;
  int local_1284;
  int local_1280;
  int local_127c;
  ulong local_1278;
  EState *local_1270;
  ulong local_1268;
  ulong local_1260;
  long local_1258;
  long local_1250;
  int local_1244;
  int local_1240;
  int local_123c;
  ulong local_1238;
  long local_1230;
  ulong local_1228;
  ulong local_1220;
  UInt32 *local_1218;
  UInt32 *local_1210;
  UInt32 *local_1208;
  UInt32 *local_1200;
  ulong local_11f8;
  ulong local_11f0;
  char local_11e8 [256];
  int local_10e8 [100];
  uint local_f58 [100];
  uint local_dc8 [100];
  uint auStack_c38 [512];
  uint auStack_438 [258];
  
  pUVar32 = s->ftab;
  pUVar7 = s->ptr;
  uVar40 = s->nblock;
  uVar35 = (ulong)(int)uVar40;
  verb = s->verbosity;
  if (9999 < (long)uVar35) {
    block = s->block;
    iVar16 = 1;
    if (1 < s->workFactor) {
      iVar16 = s->workFactor;
    }
    cVar8 = 'd';
    if (iVar16 < 100) {
      cVar8 = (char)iVar16;
    }
    uVar19 = (ulong)(uVar40 + (uVar40 & 1) + 0x22);
    local_12b8 = ((byte)(cVar8 - 1) / 3) * uVar40;
    local_1288 = local_12b8;
    local_1270 = s;
    if (3 < verb) {
      BZ2_blockSort_cold_1();
    }
    local_1290 = (UInt16 *)(block + uVar19);
    memset(pUVar32,0,0x40004);
    bVar14 = *block;
    uVar18 = (ulong)(uVar40 - 1);
    lVar21 = uVar19 + uVar18 * 2;
    uVar17 = 0;
    do {
      (block + uVar17 * 2 + lVar21)[0] = 0;
      (block + uVar17 * 2 + lVar21)[1] = 0;
      bVar27 = block[uVar17 + uVar18];
      pUVar32[CONCAT11(bVar27,bVar14)] = pUVar32[CONCAT11(bVar27,bVar14)] + 1;
      (block + uVar17 * 2 + lVar21 + -2)[0] = 0;
      (block + uVar17 * 2 + lVar21 + -2)[1] = 0;
      bVar14 = block[uVar17 + (uVar18 - 1)];
      piVar1 = (int *)((long)pUVar32 + (ulong)((uint)bVar14 * 0x400 + (uint)bVar27 * 4));
      *piVar1 = *piVar1 + 1;
      (block + uVar17 * 2 + lVar21 + -4)[0] = 0;
      (block + uVar17 * 2 + lVar21 + -4)[1] = 0;
      bVar27 = block[uVar17 + (uVar18 - 2)];
      piVar1 = (int *)((long)pUVar32 + (ulong)((uint)bVar27 * 0x400 + (uint)bVar14 * 4));
      *piVar1 = *piVar1 + 1;
      (block + uVar17 * 2 + lVar21 + -6)[0] = 0;
      (block + uVar17 * 2 + lVar21 + -6)[1] = 0;
      bVar14 = block[uVar17 + (uVar18 - 3)];
      uVar23 = (ulong)CONCAT11(bVar14,bVar27);
      pUVar32[uVar23] = pUVar32[uVar23] + 1;
      uVar2 = uVar18 + uVar17;
      uVar17 = uVar17 - 4;
    } while (6 < uVar2);
    if (3 < uVar18 + uVar17 + 4) {
      do {
        (block + uVar17 * 2 + lVar21)[0] = 0;
        (block + uVar17 * 2 + lVar21)[1] = 0;
        uVar23 = (ulong)((uint)block[uVar17 + uVar18] << 8 | (uint)(uVar23 >> 8));
        pUVar32[uVar23] = pUVar32[uVar23] + 1;
        uVar17 = uVar17 - 1;
      } while (~uVar18 != uVar17);
    }
    lVar21 = 0;
    do {
      block[lVar21 + uVar35] = block[lVar21];
      (block + lVar21 * 2 + uVar19 + uVar35 * 2)[0] = 0;
      (block + lVar21 * 2 + uVar19 + uVar35 * 2)[1] = 0;
      lVar21 = lVar21 + 1;
    } while (lVar21 != 0x22);
    local_12b0 = uVar35;
    local_1268 = uVar18;
    if (3 < verb) {
      BZ2_blockSort_cold_2();
    }
    UVar10 = *pUVar32;
    lVar21 = 0;
    do {
      UVar10 = UVar10 + pUVar32[lVar21 + 1];
      pUVar32[lVar21 + 1] = UVar10;
      lVar21 = lVar21 + 1;
    } while (lVar21 != 0x10000);
    uVar29 = (ushort)*block << 8;
    lVar21 = 0;
    uVar35 = local_1268 & 0xffffffff;
    do {
      bVar14 = block[lVar21 + uVar18];
      uVar29 = (ushort)bVar14 << 8 | uVar29 >> 8;
      UVar10 = pUVar32[uVar29];
      pUVar32[uVar29] = UVar10 - 1;
      pUVar7[(int)(UVar10 - 1)] = (UInt32)uVar35;
      bVar27 = block[lVar21 + (uVar18 - 1)];
      uVar29 = CONCAT11(bVar27,bVar14);
      UVar10 = pUVar32[uVar29];
      pUVar32[uVar29] = UVar10 - 1;
      iVar16 = (int)lVar21;
      pUVar7[(int)(UVar10 - 1)] = (uVar40 - 2) + iVar16;
      bVar14 = block[lVar21 + (uVar18 - 2)];
      uVar29 = CONCAT11(bVar14,bVar27);
      UVar10 = pUVar32[uVar29];
      pUVar32[uVar29] = UVar10 - 1;
      pUVar7[(int)(UVar10 - 1)] = (uVar40 - 3) + iVar16;
      uVar29 = CONCAT11(block[lVar21 + (uVar18 - 3)],bVar14);
      UVar10 = pUVar32[uVar29];
      pUVar32[uVar29] = UVar10 - 1;
      pUVar7[(int)(UVar10 - 1)] = (uVar40 - 4) + iVar16;
      uVar35 = (ulong)((UInt32)uVar35 - 4);
      uVar19 = local_1268 + lVar21;
      lVar21 = lVar21 + -4;
    } while (6 < uVar19);
    if (3 < local_1268 + lVar21 + 4) {
      lVar21 = lVar21 + local_1268;
      do {
        uVar29 = uVar29 >> 8 | (ushort)block[lVar21] << 8;
        UVar10 = pUVar32[uVar29];
        pUVar32[uVar29] = UVar10 - 1;
        pUVar7[(int)(UVar10 - 1)] = (UInt32)uVar35;
        uVar35 = (ulong)((UInt32)uVar35 - 1);
        bVar39 = lVar21 != 0;
        lVar21 = lVar21 + -1;
      } while (bVar39);
    }
    lVar21 = 0;
    memset(local_11e8,0,0x100);
    uVar40 = 0;
    uVar41 = 1;
    uVar42 = 2;
    uVar43 = 3;
    do {
      auStack_c38[lVar21] = uVar40;
      auStack_c38[lVar21 + 1] = uVar41;
      auStack_c38[lVar21 + 2] = uVar42;
      auStack_c38[lVar21 + 3] = uVar43;
      lVar21 = lVar21 + 4;
      uVar40 = uVar40 + (int)DAT_00272480;
      uVar41 = uVar41 + DAT_00272480._4_4_;
      uVar42 = uVar42 + DAT_00272480._8_4_;
      uVar43 = uVar43 + DAT_00272480._12_4_;
    } while (lVar21 != 0x100);
    iVar16 = 0x16c;
    do {
      iVar15 = iVar16 / 3;
      if (iVar16 < 0x300) {
        uVar35 = (ulong)iVar15;
        iVar11 = 0xff;
        if (0xff < iVar15) {
          iVar11 = iVar15;
        }
        iVar24 = 0;
        do {
          uVar40 = auStack_c38[uVar35];
          iVar30 = uVar40 * 0x100;
          UVar10 = pUVar32[iVar30 + 0x100];
          UVar5 = pUVar32[iVar30];
          iVar30 = iVar24;
          do {
            iVar38 = auStack_c38[iVar30] * 0x100;
            lVar21 = (long)(iVar15 + iVar30);
            if (pUVar32[iVar38 + 0x100] - pUVar32[iVar38] <= UVar10 - UVar5) break;
            auStack_c38[iVar15 + iVar30] = auStack_c38[iVar30];
            bVar39 = iVar15 <= iVar30;
            lVar21 = (long)iVar30;
            iVar30 = iVar30 - iVar15;
          } while (bVar39);
          auStack_c38[lVar21] = uVar40;
          uVar35 = uVar35 + 1;
          iVar24 = iVar24 + 1;
        } while (uVar35 != iVar11 + 1);
      }
      uVar40 = iVar16 - 3;
      iVar16 = iVar15;
    } while (2 < uVar40);
    local_1200 = pUVar32 + 1;
    local_1210 = pUVar7 + -1;
    local_12e0 = local_1288;
    local_1230 = 0;
    local_1278 = 0;
    uVar35 = local_12b0;
    local_1218 = pUVar32;
    do {
      uVar40 = auStack_c38[local_1230];
      uVar19 = (ulong)uVar40;
      local_12a8 = (long)(int)uVar40;
      local_1244 = uVar40 << 8;
      pUVar37 = pUVar32 + local_1244;
      uVar18 = 0;
      do {
        if (uVar18 != uVar19) {
          uVar40 = pUVar37[uVar18];
          local_12b4 = uVar40;
          if ((uVar40 >> 0x15 & 1) == 0) {
            uVar41 = (pUVar37[uVar18 + 1] & 0xffdfffff) - 1;
            local_1228 = (ulong)uVar41;
            if ((int)uVar40 < (int)uVar41) {
              local_1238 = uVar19;
              local_1220 = uVar18;
              local_1208 = pUVar37;
              if (3 < verb) {
                fprintf(_stderr,"        qsort [0x%x, 0x%x]   done %d   this %d\n",uVar19,uVar18,
                        local_1278,(ulong)((pUVar37[uVar18 + 1] & 0xffdfffff) - uVar40));
              }
              local_dc8[0] = uVar40;
              local_f58[0] = (uint)local_1228;
              local_10e8[0] = 2;
              uVar40 = 1;
              do {
                local_1298 = (ulong)(uVar40 - 1);
LAB_0019cae3:
                if (0x61 < uVar40) {
                  BZ2_bz__AssertH__fail(0x3e9);
                }
                uVar41 = local_dc8[local_1298];
                local_1260 = (ulong)uVar41;
                uVar42 = local_f58[local_1298];
                lVar21 = (long)(int)uVar42;
                iVar16 = local_10e8[local_1298];
                iVar15 = uVar42 - uVar41;
                if ((iVar15 < 0x14) || (0xe < iVar16)) {
                  if (0 < iVar15) {
                    uVar35 = 0xffffffffffffffff;
                    pIVar12 = incs;
                    do {
                      uVar35 = uVar35 + 1;
                      iVar11 = *pIVar12;
                      pIVar12 = pIVar12 + 1;
                    } while (iVar11 <= iVar15);
                    if (uVar35 != 0) {
                      local_123c = uVar41 + 1;
                      local_1240 = uVar41 + 2;
                      local_11f0 = uVar35;
                      local_1258 = lVar21;
                      do {
                        iVar15 = incs[local_11f0 - 1 & 0xffffffff];
                        local_127c = (int)local_1260;
                        iVar11 = iVar15 + local_127c;
                        lVar26 = (long)iVar11;
                        local_1284 = local_1240;
                        local_1280 = local_123c;
                        local_11f8 = local_11f0;
                        local_11f0 = local_11f0 - 1;
                        while (lVar26 <= lVar21) {
                          uVar40 = pUVar7[lVar26];
                          local_12a0 = (ulong)uVar40;
                          iVar24 = local_127c;
                          local_1250 = lVar26;
                          do {
                            UVar10 = pUVar7[iVar24];
                            BVar9 = mainGtU(UVar10 + iVar16,uVar40 + iVar16,block,local_1290,
                                            (UInt32)local_12b0,&local_12b8);
                            lVar21 = (long)(iVar15 + iVar24);
                            if (BVar9 == '\0') break;
                            pUVar7[iVar15 + iVar24] = UVar10;
                            bVar39 = iVar11 <= iVar24;
                            lVar21 = (long)iVar24;
                            iVar24 = iVar24 - iVar15;
                          } while (bVar39);
                          pUVar7[lVar21] = (UInt32)local_12a0;
                          lVar21 = local_1258;
                          if (local_1258 <= local_1250) break;
                          uVar40 = pUVar7[local_1250 + 1];
                          local_12a0 = (ulong)uVar40;
                          iVar24 = local_1280;
                          do {
                            UVar10 = pUVar7[iVar24];
                            BVar9 = mainGtU(UVar10 + iVar16,uVar40 + iVar16,block,local_1290,
                                            (UInt32)local_12b0,&local_12b8);
                            lVar21 = (long)(iVar15 + iVar24);
                            if (BVar9 == '\0') break;
                            pUVar7[iVar15 + iVar24] = UVar10;
                            bVar39 = iVar11 <= iVar24;
                            lVar21 = (long)iVar24;
                            iVar24 = iVar24 - iVar15;
                          } while (bVar39);
                          pUVar7[lVar21] = (UInt32)local_12a0;
                          lVar21 = local_1258;
                          if (local_1258 < local_1250 + 2) break;
                          uVar40 = pUVar7[local_1250 + 2];
                          local_12a0 = (ulong)uVar40;
                          iVar24 = local_1284;
                          do {
                            UVar10 = pUVar7[iVar24];
                            BVar9 = mainGtU(UVar10 + iVar16,uVar40 + iVar16,block,local_1290,
                                            (UInt32)local_12b0,&local_12b8);
                            lVar21 = (long)(iVar15 + iVar24);
                            if (BVar9 == '\0') break;
                            pUVar7[iVar15 + iVar24] = UVar10;
                            bVar39 = iVar11 <= iVar24;
                            lVar21 = (long)iVar24;
                            iVar24 = iVar24 - iVar15;
                          } while (bVar39);
                          pUVar7[lVar21] = (UInt32)local_12a0;
                          lVar26 = local_1250 + 3;
                          local_127c = local_127c + 3;
                          local_1280 = local_1280 + 3;
                          local_1284 = local_1284 + 3;
                          lVar21 = local_1258;
                          uVar35 = local_12b0;
                          pUVar32 = local_1218;
                          local_12e0 = local_12b8;
                          if (local_12b8 < 0) goto LAB_0019d417;
                        }
                      } while (1 < (long)local_11f8);
                      local_12e0 = local_12b8;
                    }
                  }
                  uVar35 = local_12b0;
                  pUVar32 = local_1218;
                  if (-1 < local_12e0) goto LAB_0019d0f6;
                  goto LAB_0019d417;
                }
                lVar26 = (long)(int)uVar41;
                bVar14 = block[pUVar7[lVar26] + iVar16];
                bVar27 = block[pUVar7[lVar21] + iVar16];
                bVar22 = bVar27;
                if (bVar14 >= bVar27 && bVar14 != bVar27) {
                  bVar22 = bVar14;
                }
                bVar4 = block[pUVar7[(int)(uVar42 + uVar41) >> 1] + iVar16];
                if (bVar14 < bVar27) {
                  bVar27 = bVar14;
                }
                if (bVar27 <= bVar4) {
                  bVar27 = bVar4;
                }
                if (bVar22 <= bVar4) {
                  bVar27 = bVar22;
                }
                uVar18 = (ulong)uVar42;
                uVar35 = local_1260;
                uVar19 = local_1260;
                uVar43 = uVar42;
LAB_0019cb86:
                uVar31 = (uint)uVar19;
                if ((int)uVar31 <= (int)uVar43) {
                  uVar35 = (ulong)(int)uVar35;
                  do {
                    uVar33 = (uint)uVar19;
                    lVar21 = (long)(int)uVar33 + -1;
                    while( true ) {
                      UVar10 = pUVar7[lVar21 + 1];
                      bVar14 = block[iVar16 + UVar10];
                      uVar31 = (uint)uVar19;
                      if (bVar14 == bVar27) break;
                      if (bVar27 <= bVar14 && bVar14 != bVar27) goto LAB_0019cbe7;
                      uVar19 = (ulong)(uVar31 + 1);
                      lVar21 = lVar21 + 1;
                      if ((int)uVar43 <= lVar21) {
                        if ((int)uVar33 <= (int)uVar43) {
                          uVar33 = uVar43;
                        }
                        uVar31 = uVar33 + 1;
                        goto LAB_0019cbe7;
                      }
                    }
                    pUVar7[lVar21 + 1] = pUVar7[uVar35];
                    pUVar7[uVar35] = UVar10;
                    uVar35 = uVar35 + 1;
                    uVar19 = (ulong)(uVar31 + 1);
                  } while ((int)uVar31 < (int)uVar43);
                  uVar31 = uVar31 + 1;
                }
LAB_0019cbe7:
                if ((int)uVar31 <= (int)uVar43) {
                  lVar21 = (long)(int)uVar31;
                  uVar18 = (ulong)(int)uVar18;
                  do {
                    lVar36 = (long)(int)uVar43 + 1;
                    uVar33 = uVar43;
                    while( true ) {
                      UVar10 = pUVar7[lVar36 + -1];
                      if (block[iVar16 + UVar10] == bVar27) break;
                      if (block[iVar16 + UVar10] < bVar27) {
                        UVar5 = pUVar7[lVar21];
                        pUVar7[lVar21] = UVar10;
                        pUVar7[lVar36 + -1] = UVar5;
                        uVar43 = uVar33 - 1;
                        uVar19 = (ulong)(uVar31 + 1);
                        goto LAB_0019cb86;
                      }
                      lVar36 = lVar36 + -1;
                      uVar33 = uVar33 - 1;
                      if (lVar36 <= lVar21) {
                        uVar33 = uVar31;
                        if ((int)uVar43 < lVar21) {
                          uVar33 = uVar43;
                        }
                        uVar43 = uVar33 - 1;
                        goto LAB_0019cc95;
                      }
                    }
                    pUVar7[lVar36 + -1] = pUVar7[uVar18];
                    pUVar7[uVar18] = UVar10;
                    uVar18 = uVar18 - 1;
                    uVar43 = uVar33 - 1;
                  } while ((int)uVar31 < (int)uVar33);
                  uVar43 = uVar33 - 1;
                }
LAB_0019cc95:
                iVar15 = (int)uVar18;
                iVar11 = (int)uVar35;
                if (iVar15 < iVar11) goto code_r0x0019cc9d;
                iVar24 = uVar31 - iVar11;
                if ((int)(iVar11 - uVar41) < (int)(uVar31 - iVar11)) {
                  iVar24 = iVar11 - uVar41;
                }
                if (0 < iVar24) {
                  uVar33 = iVar24 + 1;
                  lVar21 = 0;
                  do {
                    uVar6 = *(undefined4 *)((long)pUVar7 + lVar21 + lVar26 * 4);
                    *(undefined4 *)((long)pUVar7 + lVar21 + lVar26 * 4) =
                         *(undefined4 *)((long)pUVar7 + lVar21 + (long)(int)(uVar31 - iVar24) * 4);
                    *(undefined4 *)((long)pUVar7 + lVar21 + (long)(int)(uVar31 - iVar24) * 4) =
                         uVar6;
                    lVar21 = lVar21 + 4;
                    uVar33 = uVar33 - 1;
                  } while (1 < uVar33);
                }
                iVar30 = iVar15 - uVar43;
                iVar24 = uVar42 - iVar15;
                if (iVar30 <= (int)(uVar42 - iVar15)) {
                  iVar24 = iVar30;
                }
                if (0 < iVar24) {
                  uVar43 = iVar24 + 1;
                  pUVar32 = pUVar7;
                  do {
                    UVar10 = pUVar32[(int)uVar31];
                    pUVar32[(int)uVar31] = pUVar32[(long)(int)(uVar42 - iVar24) + 1];
                    pUVar32[(long)(int)(uVar42 - iVar24) + 1] = UVar10;
                    pUVar32 = pUVar32 + 1;
                    uVar43 = uVar43 - 1;
                  } while (1 < uVar43);
                }
                uVar34 = ((uVar41 - iVar11) + uVar31) - 1;
                uVar20 = uVar42 - iVar30;
                uVar43 = uVar20 + 1;
                iVar15 = uVar42 - uVar43;
                uVar33 = uVar42;
                uVar25 = uVar41;
                if ((int)(uVar34 - uVar41) < iVar15) {
                  iVar15 = uVar34 - uVar41;
                  uVar33 = uVar34;
                  uVar34 = uVar42;
                  uVar25 = uVar43;
                  uVar43 = uVar41;
                }
                uVar31 = (uVar41 - iVar11) + uVar31;
                uVar41 = uVar33;
                uVar42 = uVar43;
                iVar24 = iVar16 + 1;
                iVar11 = iVar16;
                if (iVar15 < (int)(uVar20 - uVar31)) {
                  uVar41 = uVar20;
                  iVar15 = uVar20 - uVar31;
                  uVar42 = uVar31;
                  uVar31 = uVar43;
                  uVar20 = uVar33;
                  iVar24 = iVar16;
                  iVar11 = iVar16 + 1;
                }
                uVar43 = uVar34;
                uVar33 = uVar25;
                iVar30 = iVar16;
                if ((int)(uVar34 - uVar25) < iVar15) {
                  uVar43 = uVar41;
                  uVar33 = uVar42;
                  iVar30 = iVar11;
                  uVar42 = uVar25;
                  uVar41 = uVar34;
                  iVar11 = iVar16;
                }
                local_dc8[local_1298] = uVar33;
                local_f58[local_1298] = uVar43;
                local_10e8[local_1298] = iVar30;
                local_dc8[uVar40] = uVar42;
                local_f58[uVar40] = uVar41;
                local_10e8[uVar40] = iVar11;
                local_dc8[(ulong)uVar40 + 1] = uVar31;
                local_f58[(ulong)uVar40 + 1] = uVar20;
                local_10e8[(ulong)uVar40 + 1] = iVar24;
                local_1298 = (ulong)(uVar40 + 2);
LAB_0019d0f6:
                uVar40 = (uint)local_1298;
              } while (0 < (int)uVar40);
              uVar35 = local_12b0;
              pUVar32 = local_1218;
              if (local_12e0 < 0) goto LAB_0019d417;
              local_1278 = (ulong)(((int)local_1278 - local_12b4) + (int)local_1228 + 1);
              local_12b4 = local_1208[local_1220];
              uVar19 = local_1238;
              uVar18 = local_1220;
              pUVar37 = local_1208;
            }
          }
          pUVar37[uVar18] = local_12b4 | 0x200000;
        }
        uVar40 = (uint)uVar35;
        uVar18 = uVar18 + 1;
      } while (uVar18 != 0x100);
      if (local_11e8[local_12a8] != '\0') {
        BZ2_bz__AssertH__fail(0x3ee);
      }
      lVar21 = local_12a8 * 4;
      puVar13 = local_1200 + local_12a8;
      lVar26 = 0;
      do {
        auStack_438[lVar26] = puVar13[-1] & 0xffdfffff;
        auStack_c38[lVar26 + 0x100] = (*puVar13 & 0xffdfffff) - 1;
        lVar26 = lVar26 + 1;
        puVar13 = puVar13 + 0x100;
      } while (lVar26 != 0x100);
      uVar19 = (long)(int)*pUVar37 & 0xffffffffffdfffff;
      uVar41 = auStack_438[local_12a8];
      if ((int)uVar19 < (int)uVar41) {
        do {
          UVar10 = (pUVar7[uVar19] + ((int)(pUVar7[uVar19] - 1) >> 0x1f & uVar40)) - 1;
          bVar14 = block[(int)UVar10];
          if (local_11e8[bVar14] == '\0') {
            uVar41 = auStack_438[bVar14];
            auStack_438[bVar14] = uVar41 + 1;
            pUVar7[(int)uVar41] = UVar10;
            uVar41 = auStack_438[local_12a8];
          }
          uVar19 = uVar19 + 1;
        } while ((long)uVar19 < (long)(int)uVar41);
      }
      iVar16 = local_1244 + 0x100;
      iVar15 = (pUVar32[iVar16] & 0xffdfffff) - 1;
      uVar42 = auStack_c38[local_12a8 + 0x100];
      if ((int)uVar42 < iVar15) {
        lVar26 = (long)iVar15;
        do {
          UVar10 = (pUVar7[lVar26] + ((int)(pUVar7[lVar26] - 1) >> 0x1f & uVar40)) - 1;
          uVar19 = (ulong)block[(int)UVar10];
          if (local_11e8[uVar19] == '\0') {
            uVar42 = auStack_c38[uVar19 + 0x100];
            auStack_c38[uVar19 + 0x100] = uVar42 - 1;
            pUVar7[(int)uVar42] = UVar10;
            uVar42 = auStack_c38[local_12a8 + 0x100];
          }
          lVar26 = lVar26 + -1;
        } while ((int)uVar42 < lVar26);
      }
      if ((uVar41 - 1 != uVar42) && ((uVar41 != 0 || (uVar42 != (uint)local_1268)))) {
        BZ2_bz__AssertH__fail(0x3ef);
      }
      s = local_1270;
      lVar26 = 0;
      do {
        pbVar3 = (byte *)((long)pUVar32 + lVar26 + lVar21 + 2);
        *pbVar3 = *pbVar3 | 0x20;
        lVar26 = lVar26 + 0x400;
      } while (lVar26 != 0x40000);
      local_11e8[local_12a8] = '\x01';
      if (local_1230 == 0xff) goto LAB_0019d4b2;
      UVar10 = *pUVar37;
      uVar41 = (pUVar32[iVar16] & 0xffdfffff) - (int)((long)(int)UVar10 & 0xffffffffffdfffffU);
      bVar14 = 0xff;
      do {
        bVar14 = bVar14 + 1;
      } while (0xfffe < (int)uVar41 >> (bVar14 & 0x1f));
      if (0 < (int)uVar41) {
        uVar19 = (ulong)uVar41;
        do {
          UVar5 = local_1210[((long)(int)UVar10 & 0xffffffffffdfffffU) + uVar19];
          UVar28 = (UInt16)((uint)(uVar19 - 1) >> (bVar14 & 0x1f));
          local_1290[(int)UVar5] = UVar28;
          if ((long)(int)UVar5 < 0x22) {
            local_1290[(int)(UVar5 + uVar40)] = UVar28;
          }
          bVar39 = 1 < uVar19;
          uVar19 = uVar19 - 1;
        } while (bVar39);
      }
      if (0xffff < (int)(uVar41 - 1) >> (bVar14 & 0x1f)) {
        BZ2_bz__AssertH__fail(0x3ea);
      }
      local_1230 = local_1230 + 1;
    } while( true );
  }
LAB_0019d42b:
  fallbackSort(s->arr1,s->arr2,pUVar32,uVar40,verb);
LAB_0019d43e:
  s->origPtr = -1;
  if (0 < (long)s->nblock) {
    lVar21 = 0;
    do {
      if (pUVar7[lVar21] == 0) {
        s->origPtr = (Int32)lVar21;
        return;
      }
      lVar21 = lVar21 + 1;
    } while (s->nblock != lVar21);
  }
  BZ2_bz__AssertH__fail(0x3eb);
  return;
code_r0x0019cc9d:
  local_10e8[local_1298] = iVar16 + 1;
  goto LAB_0019cae3;
LAB_0019d4b2:
  if (verb < 4) {
LAB_0019d417:
    uVar40 = (uint)uVar35;
    s = local_1270;
    if (2 < verb) goto LAB_0019d4f5;
  }
  else {
    fprintf(_stderr,"        %d pointers, %d sorted, %d scanned\n",uVar35 & 0xffffffff,local_1278,
            (ulong)(uVar40 - (int)local_1278));
LAB_0019d4f5:
    fprintf(_stderr,"      %d work, %d block, ratio %5.2f\n",
            (double)((float)(local_1288 - local_12e0) / (float)(int)uVar40));
  }
  if (-1 < local_12e0) goto LAB_0019d43e;
  if (1 < verb) {
    BZ2_blockSort_cold_3();
  }
  goto LAB_0019d42b;
}

Assistant:

void BZ2_blockSort ( EState* s )
{
   UInt32* ptr    = s->ptr; 
   UChar*  block  = s->block;
   UInt32* ftab   = s->ftab;
   Int32   nblock = s->nblock;
   Int32   verb   = s->verbosity;
   Int32   wfact  = s->workFactor;
   UInt16* quadrant;
   Int32   budget;
   Int32   budgetInit;
   Int32   i;

   if (nblock < 10000) {
      fallbackSort ( s->arr1, s->arr2, ftab, nblock, verb );
   } else {
      /* Calculate the location for quadrant, remembering to get
         the alignment right.  Assumes that &(block[0]) is at least
         2-byte aligned -- this should be ok since block is really
         the first section of arr2.
      */
      i = nblock+BZ_N_OVERSHOOT;
      if (i & 1) i++;
      quadrant = (UInt16*)(&(block[i]));

      /* (wfact-1) / 3 puts the default-factor-30
         transition point at very roughly the same place as 
         with v0.1 and v0.9.0.  
         Not that it particularly matters any more, since the
         resulting compressed stream is now the same regardless
         of whether or not we use the main sort or fallback sort.
      */
      if (wfact < 1  ) wfact = 1;
      if (wfact > 100) wfact = 100;
      budgetInit = nblock * ((wfact-1) / 3);
      budget = budgetInit;

      mainSort ( ptr, block, quadrant, ftab, nblock, verb, &budget );
      if (verb >= 3) 
         VPrintf3 ( "      %d work, %d block, ratio %5.2f\n",
                    budgetInit - budget,
                    nblock, 
                    (float)(budgetInit - budget) /
                    (float)(nblock==0 ? 1 : nblock) ); 
      if (budget < 0) {
         if (verb >= 2) 
            VPrintf0 ( "    too repetitive; using fallback"
                       " sorting algorithm\n" );
         fallbackSort ( s->arr1, s->arr2, ftab, nblock, verb );
      }
   }

   s->origPtr = -1;
   for (i = 0; i < s->nblock; i++)
      if (ptr[i] == 0)
         { s->origPtr = i; break; };

   AssertH( s->origPtr != -1, 1003 );
}